

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseException.h
# Opt level: O0

void AutoArgParse::printUnParsed
               (ostringstream *os,
               deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *flagInsertionOrder,FlagMap *flags)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  reference __k;
  mapped_type *this;
  pointer pFVar5;
  undefined4 extraout_var;
  ParseToken *pPVar6;
  mapped_type *flagObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *flag;
  const_iterator __end1;
  const_iterator __begin1;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  bool first;
  FlagMap *flags_local;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *flagInsertionOrder_local;
  ostringstream *os_local;
  
  bVar1 = true;
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin((const_iterator *)&__end1._M_node,flagInsertionOrder);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((const_iterator *)&flag,flagInsertionOrder);
  while (bVar2 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&flag), bVar2) {
    __k = std::
          _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
          ::operator*((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                       *)&__end1._M_node);
    this = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>_>_>
           ::at(flags,__k);
    pFVar5 = std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>::
             operator->(this);
    uVar3 = (*(pFVar5->super_ParseToken)._vptr_ParseToken[5])();
    if ((uVar3 & 1) == 0) {
      pPVar6 = &std::
                unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>::
                operator->(this)->super_ParseToken;
      bVar2 = ParseToken::parsed(pPVar6);
      if (!bVar2) {
        pPVar6 = &std::
                  unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>::
                  operator->(this)->super_ParseToken;
        bVar2 = ParseToken::available(pPVar6);
        if (bVar2) {
          if (bVar1) {
            std::operator<<((ostream *)os," ");
            bVar1 = false;
          }
          else {
            std::operator<<((ostream *)os,", ");
          }
          pFVar5 = std::
                   unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>
                   ::operator->(this);
          if ((pFVar5->super_ParseToken).policy == OPTIONAL) {
            std::operator<<((ostream *)os,"[");
          }
          std::operator<<((ostream *)os,(string *)__k);
          pFVar5 = std::
                   unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>
                   ::operator->(this);
          if ((pFVar5->super_ParseToken).policy == OPTIONAL) {
            std::operator<<((ostream *)os,"]");
          }
        }
      }
    }
    else {
      pFVar5 = std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>
               ::operator->(this);
      iVar4 = (*(pFVar5->super_ParseToken)._vptr_ParseToken[6])();
      printUnParsed(os,(deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT44(extraout_var,iVar4),flags);
    }
    std::
    _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
    ::operator++((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                  *)&__end1._M_node);
  }
  return;
}

Assistant:

void printUnParsed(std::ostringstream& os,
                   const std::deque<std::string>& flagInsertionOrder,
                   const FlagMap& flags) {
    bool first = true;
    for (auto& flag : flagInsertionOrder) {
        auto& flagObj = flags.at(flag);
        if (flagObj->isExclusiveGroup()) {
            printUnParsed(os, flagObj->getFlagInsertionOrder(), flags);
            continue;
        }
        if (!flagObj->parsed() && flagObj->available()) {
            if (first) {
                os << " ";
                first = false;
            } else {
                os << ", ";
            }
            if (flagObj->policy == Policy::OPTIONAL) {
                os << "[";
            }
            os << flag;
            if (flagObj->policy == Policy::OPTIONAL) {
                os << "]";
            }
        }
    }
}